

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O3

size_t duckdb_brotli::BrotliEncoderGetPreparedDictionarySize
                 (BrotliEncoderPreparedDictionary *prepared_dictionary)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  PreparedDictionary *dictionary;
  BrotliEncoderPreparedDictionary *pBVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar1 = *(int *)prepared_dictionary;
  if (iVar1 == -0x2143121e) {
    prepared_dictionary = *(BrotliEncoderPreparedDictionary **)(prepared_dictionary + 0x20);
    iVar1 = *(int *)prepared_dictionary;
    lVar8 = 0x28;
  }
  else {
    lVar8 = 0;
  }
  if (iVar1 == -0x2143121d) {
    return lVar8 + (4L << ((byte)prepared_dictionary[0x14] & 0x3f)) +
           (2L << ((byte)prepared_dictionary[0x10] & 0x3f)) +
           (ulong)*(uint *)(prepared_dictionary + 4) * 4 + 0x20;
  }
  if (iVar1 != -0x2143121f) {
    if (iVar1 != -0x21431220) {
      return 0;
    }
    return lVar8 + (ulong)*(uint *)(prepared_dictionary + 8) +
           (4L << ((byte)prepared_dictionary[0x14] & 0x3f)) +
           (2L << ((byte)prepared_dictionary[0x10] & 0x3f)) +
           (ulong)*(uint *)(prepared_dictionary + 4) * 4 + 0x18;
  }
  lVar3 = *(long *)(prepared_dictionary + 0x198);
  lVar7 = 0x528;
  if (lVar3 != 0) {
    lVar6 = 0;
    do {
      sVar2 = BrotliEncoderGetPreparedDictionarySize
                        (*(BrotliEncoderPreparedDictionary **)
                          (prepared_dictionary + lVar6 * 8 + 0x1a0));
      if (sVar2 == 0) {
        return 0;
      }
      lVar7 = lVar7 + sVar2;
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  if (*(int *)(prepared_dictionary + 0x220) == 0) {
    pBVar5 = prepared_dictionary + 0x470;
    lVar3 = 1;
  }
  else {
    lVar3 = *(long *)(prepared_dictionary + 0x468);
    lVar7 = lVar7 + lVar3 * 0xa8;
    if (lVar3 == 0) goto LAB_002f8c91;
    pBVar5 = *(BrotliEncoderPreparedDictionary **)(prepared_dictionary + 0x518);
  }
  pBVar5 = pBVar5 + 0xa0;
  do {
    lVar6 = lVar7 + 0x10000 + *(long *)(pBVar5 + -0x60) * 0xc;
    if (*(long *)(pBVar5 + -0x30) == 0) {
      lVar6 = lVar7 + *(long *)(pBVar5 + -0x60) * 0xc;
    }
    lVar4 = lVar6 + 0x8000;
    if (*(long *)(pBVar5 + -0x28) == 0) {
      lVar4 = lVar6;
    }
    if (*(long *)(pBVar5 + -0x18) != 0) {
      lVar4 = lVar4 + *(long *)(pBVar5 + -0x20) * 2;
    }
    if (*(long *)(pBVar5 + -8) != 0) {
      lVar4 = lVar4 + *(long *)(pBVar5 + -0x10) * 4;
    }
    lVar7 = lVar4 + 0xb0;
    if (*(long *)pBVar5 == 0) {
      lVar7 = lVar4;
    }
    pBVar5 = pBVar5 + 0xa8;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
LAB_002f8c91:
  return lVar7 + lVar8;
}

Assistant:

size_t duckdb_brotli::BrotliEncoderGetPreparedDictionarySize(
    const BrotliEncoderPreparedDictionary* prepared_dictionary) {
  /* First field of dictionary structs */
  const BrotliEncoderPreparedDictionary* prepared = prepared_dictionary;
  uint32_t magic = *((const uint32_t*)prepared);
  size_t overhead = 0;
  if (magic == kManagedDictionaryMagic) {
    const ManagedDictionary* managed = (const ManagedDictionary*)prepared;
    overhead = sizeof(ManagedDictionary);
    magic = *managed->dictionary;
    prepared = (const BrotliEncoderPreparedDictionary*)managed->dictionary;
  }

  if (magic == kPreparedDictionaryMagic) {
    const PreparedDictionary* dictionary =
        (const PreparedDictionary*)prepared;
    /* Keep in sync with step 3 of CreatePreparedDictionary */
    return sizeof(PreparedDictionary) + dictionary->source_size +
        (sizeof(uint32_t) << dictionary->slot_bits) +
        (sizeof(uint16_t) << dictionary->bucket_bits) +
        (sizeof(uint32_t) * dictionary->num_items) + overhead;
  } else if (magic == kLeanPreparedDictionaryMagic) {
    const PreparedDictionary* dictionary =
        (const PreparedDictionary*)prepared;
    /* Keep in sync with step 3 of CreatePreparedDictionary */
    return sizeof(PreparedDictionary) + sizeof(uint8_t*) +
        (sizeof(uint32_t) << dictionary->slot_bits) +
        (sizeof(uint16_t) << dictionary->bucket_bits) +
        (sizeof(uint32_t) * dictionary->num_items) + overhead;
  } else if (magic == kSharedDictionaryMagic) {
    const SharedEncoderDictionary* dictionary =
        (const SharedEncoderDictionary*)prepared;
    const CompoundDictionary* compound = &dictionary->compound;
    const ContextualEncoderDictionary* contextual = &dictionary->contextual;
    size_t result = sizeof(*dictionary);
    size_t i;
    size_t num_instances;
    const BrotliEncoderDictionary* instances;
    for (i = 0; i < compound->num_prepared_instances_; i++) {
      size_t size = BrotliEncoderGetPreparedDictionarySize(
          (const BrotliEncoderPreparedDictionary*)
          compound->prepared_instances_[i]);
      if (!size) return 0;  /* error */
      result += size;
    }
    if (contextual->context_based) {
      num_instances = contextual->num_instances_;
      instances = contextual->instances_;
      result += sizeof(*instances) * num_instances;
    } else {
      num_instances = 1;
      instances = &contextual->instance_;
    }
    for (i = 0; i < num_instances; i++) {
      const BrotliEncoderDictionary* dict = &instances[i];
      result += dict->trie.pool_capacity * sizeof(BrotliTrieNode);
      if (dict->hash_table_data_words_) {
        result += sizeof(kStaticDictionaryHashWords);
      }
      if (dict->hash_table_data_lengths_) {
        result += sizeof(kStaticDictionaryHashLengths);
      }
      if (dict->buckets_data_) {
        result += sizeof(*dict->buckets_data_) * dict->buckets_alloc_size_;
      }
      if (dict->dict_words_data_) {
        result += sizeof(*dict->dict_words) * dict->dict_words_alloc_size_;
      }
      if (dict->words_instance_) {
        result += sizeof(*dict->words_instance_);
        /* data_size not added here: it is never allocated by the
           SharedEncoderDictionary, instead it always points to the file
           already loaded in memory. So if the caller wants to include
           this memory as well, add the size of the loaded dictionary
           file to this. */
      }
    }
    return result + overhead;
  }
  return 0;  /* error */
}